

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O1

BLOCK_SIZE av1_predict_max_partition(AV1_COMP *cpi,MACROBLOCK *x,float *features)

{
  double dVar1;
  MAX_PART_PRED_MODE MVar2;
  int i;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  float probs [4];
  float scores [4];
  float local_38 [8];
  
  local_38[4] = 0.0;
  local_38[5] = 0.0;
  local_38[6] = 0.0;
  local_38[7] = 0.0;
  (*av1_nn_predict)(features,&av1_max_part_pred_nn_config,1,local_38 + 4);
  if ((cpi->sf).part_sf.auto_max_partition_based_on_simple_motion == '\x01') {
    uVar5 = 0;
    uVar4 = 1;
    do {
      if (local_38[4] < local_38[uVar4 + 4]) {
        uVar5 = uVar4 & 0xffffffff;
        local_38[4] = local_38[uVar4 + 4];
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != 4);
  }
  else {
    local_38[0] = 0.0;
    local_38[1] = 0.0;
    local_38[2] = 0.0;
    local_38[3] = 0.0;
    av1_nn_softmax(local_38 + 4,local_38,4);
    MVar2 = (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion;
    uVar5 = 3;
    if (MVar2 == '\x03') {
      uVar3 = av1_get_perpixel_variance_facade
                        (cpi,&x->e_mbd,&x->plane[0].src,((cpi->common).seq_params)->sb_size,0);
      if (uVar3 < 0x11) goto LAB_001ed83c;
      dVar1 = *(double *)(&DAT_004fe3d0 + (ulong)(uVar3 < 0x80) * 8);
      uVar5 = 3;
      do {
        if (uVar5 < 3) {
          local_38[uVar5] = local_38[uVar5 + 1] + local_38[uVar5];
        }
        if (dVar1 < (double)local_38[uVar5]) goto LAB_001ed83c;
        bVar6 = uVar5 != 0;
        uVar5 = uVar5 - 1;
      } while (bVar6);
    }
    else {
      if (MVar2 != '\x02') goto LAB_001ed83c;
      uVar5 = 3;
      do {
        if (uVar5 < 3) {
          local_38[uVar5] = local_38[uVar5 + 1] + local_38[uVar5];
        }
        if (0.2 < local_38[uVar5]) goto LAB_001ed83c;
        bVar6 = uVar5 != 0;
        uVar5 = uVar5 - 1;
      } while (bVar6);
    }
    uVar5 = 0xffffffff;
  }
LAB_001ed83c:
  return (char)uVar5 * '\x03' + BLOCK_16X16;
}

Assistant:

BLOCK_SIZE av1_predict_max_partition(const AV1_COMP *const cpi,
                                     const MACROBLOCK *const x,
                                     const float *features) {
  float scores[MAX_NUM_CLASSES_MAX_MIN_PART_PRED] = { 0.0f };
  const NN_CONFIG *nn_config = &av1_max_part_pred_nn_config;

  assert(cpi->sf.part_sf.auto_max_partition_based_on_simple_motion !=
         NOT_IN_USE);

  av1_nn_predict(features, nn_config, 1, scores);

  int result = MAX_NUM_CLASSES_MAX_MIN_PART_PRED - 1;
  if (cpi->sf.part_sf.auto_max_partition_based_on_simple_motion ==
      DIRECT_PRED) {
    result = 0;
    float max_score = scores[0];
    for (int i = 1; i < MAX_NUM_CLASSES_MAX_MIN_PART_PRED; ++i) {
      if (scores[i] > max_score) {
        max_score = scores[i];
        result = i;
      }
    }
    return get_block_size(result);
  }

  float probs[MAX_NUM_CLASSES_MAX_MIN_PART_PRED] = { 0.0f };
  av1_nn_softmax(scores, probs, MAX_NUM_CLASSES_MAX_MIN_PART_PRED);

  if (cpi->sf.part_sf.auto_max_partition_based_on_simple_motion ==
      RELAXED_PRED) {
    for (result = MAX_NUM_CLASSES_MAX_MIN_PART_PRED - 1; result >= 0;
         --result) {
      if (result < MAX_NUM_CLASSES_MAX_MIN_PART_PRED - 1) {
        probs[result] += probs[result + 1];
      }
      if (probs[result] > 0.2) break;
    }
  } else if (cpi->sf.part_sf.auto_max_partition_based_on_simple_motion ==
             ADAPT_PRED) {
    const BLOCK_SIZE sb_size = cpi->common.seq_params->sb_size;
    // TODO(debargha): x->source_variance is unavailable at this point,
    // so compute. The redundant recomputation later can be removed.
    const unsigned int source_variance = av1_get_perpixel_variance_facade(
        cpi, &x->e_mbd, &x->plane[0].src, sb_size, AOM_PLANE_Y);
    if (source_variance > 16) {
      const double thresh = source_variance < 128 ? 0.05 : 0.1;
      for (result = MAX_NUM_CLASSES_MAX_MIN_PART_PRED - 1; result >= 0;
           --result) {
        if (result < MAX_NUM_CLASSES_MAX_MIN_PART_PRED - 1) {
          probs[result] += probs[result + 1];
        }
        if (probs[result] > thresh) break;
      }
    }
  }

  return get_block_size(result);
}